

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_IFC(Context *ctx)

{
  size_t in_R8;
  char *pcVar1;
  char src1 [64];
  char src0 [64];
  char acStack_a8 [64];
  char local_68 [72];
  
  if ((ulong)ctx->instruction_controls < 7) {
    pcVar1 = *(char **)(get_METAL_comparison_string_scalar_comps +
                       (ulong)ctx->instruction_controls * 8);
  }
  else {
    failf(ctx,"%s","unknown comparison control");
    pcVar1 = "";
  }
  make_METAL_srcarg_string(ctx,0,1,local_68,in_R8);
  make_METAL_srcarg_string(ctx,1,1,acStack_a8,in_R8);
  output_line(ctx,"if (%s %s %s) {",local_68,pcVar1,acStack_a8);
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_IFC(Context *ctx)
{
    const char *comp = get_METAL_comparison_string_scalar(ctx);
    char src0[64]; make_METAL_srcarg_string_scalar(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_scalar(ctx, 1, src1, sizeof (src1));
    output_line(ctx, "if (%s %s %s) {", src0, comp, src1);
    ctx->indent++;
}